

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O2

int SHA384_512Reset(SHA512Context *context,uint64_t *H0)

{
  long lVar1;
  
  if (context != (SHA512Context *)0x0) {
    context->Length_Low = 0;
    context->Length_High = 0;
    context->Message_Block_Index = 0;
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      context->Intermediate_Hash[lVar1] = H0[lVar1];
    }
    context->Computed = 0;
    context->Corrupted = 0;
    return 0;
  }
  return 1;
}

Assistant:

static int SHA384_512Reset(SHA512Context *context, uint64_t H0[])
#endif /* USE_32BIT_ONLY */
{
    int i;
    if (!context)
        return shaNull;

    context->Message_Block_Index = 0;

#ifdef USE_32BIT_ONLY
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;

    for (i = 0; i < SHA512HashSize / 4; i++)
        context->Intermediate_Hash[i] = H0[i];
#else /* !USE_32BIT_ONLY */
    context->Length_High = context->Length_Low = 0;

    for (i = 0; i < SHA512HashSize / 8; i++)
        context->Intermediate_Hash[i] = H0[i];
#endif /* USE_32BIT_ONLY */

    context->Computed = 0;
    context->Corrupted = 0;

    return shaSuccess;
}